

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int i2c_write_byte_data(uint handle,uint reg,uint32_t val)

{
  int iVar1;
  uint32_t val_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &val_local;
  ext[0].size = 4;
  val_local = val;
  iVar1 = pigpio_command_ext(gPigCommand,0x3e,handle,reg,4,1,ext,1);
  return iVar1;
}

Assistant:

int i2c_write_byte_data(unsigned handle, unsigned reg, uint32_t val)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=4
   ## extension ##
   uint32_t val
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &val;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_I2CWB, handle, reg, 4, 1, ext, 1);
}